

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

void __thiscall GEO::Process::SpinLockArray::acquire_spinlock(SpinLockArray *this,index_t i)

{
  byte *pbVar1;
  byte bVar2;
  
  do {
    LOCK();
    pbVar1 = (byte *)((long)(this->spinlocks_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start +
                     ((long)(int)(i & 0x1f) >> 3) + (ulong)(i >> 5) * 4);
    bVar2 = *pbVar1;
    *pbVar1 = *pbVar1 | '\x01' << (i & 7);
    UNLOCK();
  } while ((bVar2 >> (i & 7) & 1) != 0);
  return;
}

Assistant:

void acquire_spinlock(index_t i) {
                geo_thread_sync_assert(i < size());
                index_t w = i >> 5;
                index_t b = i & 31;
                while(atomic_bittestandset_x86(&spinlocks_[w], Numeric::uint32(b))) {
                    // Intel recommends to have a PAUSE asm instruction
                    // in the spinlock loop. It is generated using the
                    // following intrinsic function of GCC.
                    geo_pause();
                }
            }